

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

String * File::getDirectoryName(String *__return_storage_ptr__,String *file)

{
  char cVar1;
  char *pcVar2;
  usize length;
  
  pcVar2 = String::operator_cast_to_char_(file);
  length = file->data->len;
  do {
    if (pcVar2 + (length - 1) < pcVar2) {
      __return_storage_ptr__->data = &__return_storage_ptr__->_data;
      (__return_storage_ptr__->_data).ref = 0;
      (__return_storage_ptr__->_data).str = ".";
      (__return_storage_ptr__->_data).len = 1;
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[length - 1];
    length = length - 1;
  } while ((cVar1 != '\\') && (cVar1 != '/'));
  String::substr(__return_storage_ptr__,file,0,length);
  return __return_storage_ptr__;
}

Assistant:

String File::getDirectoryName(const String& file)
{
  const char* start = file;
  const char* pos = &start[file.length() - 1];
  for(; pos >= start; --pos)
    if(*pos == '\\' || *pos == '/')
      return file.substr(0, pos - start);
  return String(".");
}